

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_hashmap.h
# Opt level: O2

void __thiscall
v_hashmap<substring,_unsigned_long>::iter
          (v_hashmap<substring,_unsigned_long> *this,_func_void_substring_unsigned_long *func)

{
  hash_elem *phVar1;
  
  for (phVar1 = (this->dat)._begin; phVar1 != (this->dat).end_array; phVar1 = phVar1 + 1) {
    if (phVar1->occupied == true) {
      (*func)(phVar1->key,phVar1->val);
    }
  }
  return;
}

Assistant:

void iter(void (*func)(K, V))
  {  // for (size_t lp=0; lp<base_size(); lp++) {
    for (hash_elem* e = dat.begin(); e != dat.end_array; e++)
    {  // hash_elem* e = dat.begin()+lp;
      if (e->occupied)
      {  // printf("  [lp=%d\tocc=%d\thash=%llu]\n", lp, e->occupied, e->hash);
        func(e->key, e->val);
      }
    }
  }